

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O0

_func_void_void_ptr * __thiscall
__henson__Puppet__get_function<void(*)(void*)>_void__char_const___
          (Puppet *this,void *lib,char *name)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  _func_void_void_ptr *f;
  undefined1 in_stack_000000e0 [16];
  undefined1 in_stack_000000f0 [16];
  undefined7 in_stack_fffffffffffffe98;
  undefined1 uVar1;
  char **in_stack_fffffffffffffea8;
  char *local_148;
  size_t local_140;
  string local_138 [32];
  _func_void_void_ptr *local_118;
  undefined1 local_110 [24];
  undefined1 local_f8 [56];
  undefined8 local_c0;
  undefined1 *local_b8;
  char *local_b0;
  size_t local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  undefined8 *local_50;
  char *local_48;
  size_t sStack_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  local_118 = (_func_void_void_ptr *)dlsym(in_RSI,in_RDX);
  if (local_118 == (_func_void_void_ptr *)0x0) {
    uVar1 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = &local_148;
    local_70 = "Could not load {}() in {}\n{}\n";
    local_60 = "Could not load {}() in {}\n{}\n";
    local_148 = "Could not load {}() in {}\n{}\n";
    local_58 = local_68;
    local_140 = std::char_traits<char>::length((char_type *)0x196cf1);
    local_8 = local_70;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dlerror();
    local_78 = local_138;
    local_88 = local_148;
    sStack_80 = local_140;
    local_90 = local_110;
    local_a0 = &stack0xfffffffffffffea0;
    local_50 = &local_88;
    local_b0 = local_148;
    local_a8 = local_140;
    local_98 = in_RDI + 0x70;
    local_48 = local_b0;
    sStack_40 = local_a8;
    fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const*&,std::__cxx11::string&,char*&>
              (in_stack_fffffffffffffea8,args_1,(char **)CONCAT17(uVar1,in_stack_fffffffffffffe98));
    local_30 = &local_c0;
    local_38 = local_f8;
    local_20 = 0xcdc;
    local_c0 = 0xcdc;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    local_b8 = local_38;
    fmt::v8::vformat_abi_cxx11_((string_view)in_stack_000000f0,(format_args)in_stack_000000e0);
    std::runtime_error::runtime_error(this_00,local_138);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_118;
}

Assistant:

T                   get_function(void* lib, const char* name)
    {
        T f = (T) dlsym(lib, name);
        if (f == NULL)
            throw std::runtime_error(fmt::format("Could not load {}() in {}\n{}\n", name, filename_, dlerror()));
        return f;
    }